

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O2

void __thiscall
qclab::qgates::SWAP<std::complex<double>_>::SWAP(SWAP<std::complex<double>_> *this,int *qubits)

{
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00131538;
  setQubits(this,qubits);
  return;
}

Assistant:

SWAP( const int* qubits )
        {
          setQubits( qubits ) ;
        }